

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  vq_node *pSrc;
  
  if (num != 0) {
    lVar6 = 0;
    do {
      puVar1 = (undefined4 *)((long)pSrc_void + lVar6);
      *(undefined4 *)((long)pDst_void + lVar6) = *puVar1;
      *(undefined4 *)((long)pDst_void + lVar6 + 4) = puVar1[1];
      uVar3 = *(undefined8 *)(puVar1 + 4);
      uVar4 = *(undefined8 *)(puVar1 + 6);
      uVar5 = *(undefined8 *)(puVar1 + 8);
      puVar2 = (undefined8 *)((long)pDst_void + lVar6 + 8);
      *puVar2 = *(undefined8 *)(puVar1 + 2);
      puVar2[1] = uVar3;
      puVar2 = (undefined8 *)((long)pDst_void + lVar6 + 0x18);
      *puVar2 = uVar4;
      puVar2[1] = uVar5;
      *(undefined4 *)((long)pDst_void + lVar6 + 0x27) = *(undefined4 *)((long)puVar1 + 0x27);
      lVar6 = lVar6 + 0x30;
    } while (puVar1 + 0xc != (undefined4 *)((ulong)num * 0x30 + (long)pSrc_void));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }